

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20250127::Mutex::ReaderLock(Mutex *this)

{
  GraphId id_00;
  ulong uVar1;
  bool bVar2;
  ulong local_68;
  intptr_t v;
  GraphId id;
  Mutex *this_local;
  memory_order __b;
  
  id_00 = DebugOnlyDeadlockCheck(this);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  local_68 = (this->mu_).super___atomic_base<long>._M_i;
  do {
    if ((local_68 & 0x1c) != 0) {
      LockSlow(this,(MuHow)kSharedS,(Condition *)0x0,0);
      break;
    }
    LOCK();
    uVar1 = (this->mu_).super___atomic_base<long>._M_i;
    bVar2 = local_68 == uVar1;
    if (bVar2) {
      (this->mu_).super___atomic_base<long>._M_i = (local_68 | 1) + 0x100;
      uVar1 = local_68;
    }
    UNLOCK();
    local_68 = uVar1;
  } while (!bVar2);
  DebugOnlyLockEnter(this,id_00);
  return;
}

Assistant:

void Mutex::ReaderLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_read_lock);
  GraphId id = DebugOnlyDeadlockCheck(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  for (;;) {
    // If there are non-readers holding the lock, use the slow loop.
    if (ABSL_PREDICT_FALSE(v & (kMuWriter | kMuWait | kMuEvent)) != 0) {
      this->LockSlow(kShared, nullptr, 0);
      break;
    }
    // We can avoid the loop and only use the CAS when the lock is free or
    // only held by readers.
    if (ABSL_PREDICT_TRUE(mu_.compare_exchange_weak(
            v, (kMuReader | v) + kMuOne, std::memory_order_acquire,
            std::memory_order_relaxed))) {
      break;
    }
  }
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_read_lock, 0);
}